

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O3

void glob_startup_dialog(t_pd *dummy,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  t_namelist *ptVar2;
  int which;
  t_float tVar3;
  
  namelist_free((pd_maininstance.pd_stuff)->st_externlist);
  (pd_maininstance.pd_stuff)->st_externlist = (t_namelist *)0x0;
  tVar3 = atom_getfloatarg(0,argc,argv);
  sys_defeatrt = (int)tVar3;
  ptVar1 = atom_getsymbolarg(1,argc,argv);
  sys_flags = sys_decodedialog(ptVar1);
  if (2 < argc) {
    which = 2;
    do {
      ptVar1 = atom_getsymbolarg(which,argc,argv);
      ptVar1 = sys_decodedialog(ptVar1);
      if (*ptVar1->s_name != '\0') {
        ptVar2 = namelist_append_files((pd_maininstance.pd_stuff)->st_externlist,ptVar1->s_name);
        (pd_maininstance.pd_stuff)->st_externlist = ptVar2;
      }
      which = which + 1;
    } while (argc != which);
  }
  return;
}

Assistant:

void glob_startup_dialog(t_pd *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    namelist_free(STUFF->st_externlist);
    STUFF->st_externlist = 0;
    sys_defeatrt = atom_getfloatarg(0, argc, argv);
    sys_flags = sys_decodedialog(atom_getsymbolarg(1, argc, argv));
    for (i = 0; i < argc-2; i++)
    {
        t_symbol *s = sys_decodedialog(atom_getsymbolarg(i+2, argc, argv));
        if (*s->s_name)
            STUFF->st_externlist =
                namelist_append_files(STUFF->st_externlist, s->s_name);
    }
}